

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

WebSocketResponse *
kj::_::convertToReturn<kj::HttpClient::WebSocketResponse>
          (WebSocketResponse *__return_storage_ptr__,
          ExceptionOr<kj::HttpClient::WebSocketResponse> *result)

{
  bool bVar1;
  Exception *exception_1;
  
  bVar1 = (result->super_ExceptionOrValue).exception.ptr.isSet;
  if ((result->value).ptr.isSet == true) {
    if (bVar1 != false) {
      throwRecoverableException(&(result->super_ExceptionOrValue).exception.ptr.field_1.value,0);
    }
    HttpClient::WebSocketResponse::WebSocketResponse
              (__return_storage_ptr__,&(result->value).ptr.field_1.value);
    return __return_storage_ptr__;
  }
  if (bVar1 != false) {
    throwFatalException(&(result->super_ExceptionOrValue).exception.ptr.field_1.value,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }